

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall
LruHash<IPAsKeyLRU>::LruMoveToMostRecent(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool stored)

{
  bool stored_local;
  IPAsKeyLRU *key_local;
  LruHash<IPAsKeyLRU> *this_local;
  
  if (key != (IPAsKeyLRU *)0x0) {
    if (!stored) {
      LruUnlink(this,key);
    }
    key->LessRecentKey = this->MostRecentlyUsed;
    if (this->MostRecentlyUsed != (IPAsKeyLRU *)0x0) {
      this->MostRecentlyUsed->MoreRecentKey = key;
    }
    this->MostRecentlyUsed = key;
    if (this->LeastRecentlyUsed == (IPAsKeyLRU *)0x0) {
      this->LeastRecentlyUsed = key;
    }
  }
  return;
}

Assistant:

void LruMoveToMostRecent(KeyObj * key, bool stored)
    {
        if (key != NULL)
        {
            if (!stored)
            {
                LruUnlink(key);
            }
            key->LessRecentKey = MostRecentlyUsed;
            if (MostRecentlyUsed != NULL)
            {
                MostRecentlyUsed->MoreRecentKey = key;
            }
            MostRecentlyUsed = key;

            if (LeastRecentlyUsed == NULL)
            {
                LeastRecentlyUsed = key;
            }
        }
    }